

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiComponentRDF.cpp
# Opt level: O0

void __thiscall
OpenMD::MultiComponentRDF::processOverlapping
          (MultiComponentRDF *this,SelectionManager *sman,int pairIndex)

{
  SelectionManager *this_00;
  undefined4 in_EDX;
  long *in_RDI;
  int j;
  int i;
  StuntDouble *sd2;
  StuntDouble *sd1;
  StuntDouble *in_stack_ffffffffffffffd8;
  SelectionManager *in_stack_ffffffffffffffe0;
  
  for (this_00 = (SelectionManager *)
                 SelectionManager::beginSelected
                           (in_stack_ffffffffffffffe0,(int *)in_stack_ffffffffffffffd8);
      this_00 != (SelectionManager *)0x0;
      this_00 = (SelectionManager *)SelectionManager::nextSelected(this_00,(int *)0x0)) {
    for (in_stack_ffffffffffffffd8 =
              SelectionManager::nextSelected(this_00,(int *)in_stack_ffffffffffffffd8);
        in_stack_ffffffffffffffd8 != (StuntDouble *)0x0;
        in_stack_ffffffffffffffd8 =
             SelectionManager::nextSelected(this_00,(int *)in_stack_ffffffffffffffd8)) {
      (**(code **)(*in_RDI + 0x48))(in_RDI,this_00,in_stack_ffffffffffffffd8,in_EDX);
    }
  }
  return;
}

Assistant:

void MultiComponentRDF::processOverlapping(SelectionManager& sman,
                                             int pairIndex) {
    StuntDouble* sd1;
    StuntDouble* sd2;
    int i;
    int j;

    // This is the same as a pairwise loop structure:
    // for (int i = 0;  i < n-1 ; ++i ) {
    //   for (int j = i + 1; j < n; ++j) {}
    // }

    for (sd1 = sman.beginSelected(i); sd1 != NULL; sd1 = sman.nextSelected(i)) {
      for (j = i, sd2 = sman.nextSelected(j); sd2 != NULL;
           sd2 = sman.nextSelected(j)) {
        collectHistograms(sd1, sd2, pairIndex);
      }
    }
  }